

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::FindAllConnections
          (cmGraphVizWriter *this,ConnectionsMap *connectionMap,cmLinkItem *rootItem,
          Connections *extendedCons)

{
  initializer_list<cmLinkItem> __l;
  allocator_type local_92;
  less<cmLinkItem> local_91;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> visitedItems;
  cmLinkItem local_60;
  
  cmLinkItem::cmLinkItem(&local_60,rootItem);
  __l._M_len = 1;
  __l._M_array = &local_60;
  std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set
            (&visitedItems,__l,&local_91,&local_92);
  cmLinkItem::~cmLinkItem(&local_60);
  FindAllConnections(this,connectionMap,rootItem,extendedCons,&visitedItems);
  std::
  _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
  ::~_Rb_tree(&visitedItems._M_t);
  return;
}

Assistant:

void cmGraphVizWriter::FindAllConnections(const ConnectionsMap& connectionMap,
                                          const cmLinkItem& rootItem,
                                          Connections& extendedCons)
{
  std::set<cmLinkItem> visitedItems = { rootItem };
  this->FindAllConnections(connectionMap, rootItem, extendedCons,
                           visitedItems);
}